

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestIterationStart
          (PrettyUnitTestResultPrinter *this,UnitTest *unit_test,int iteration)

{
  bool bVar1;
  int32_t iVar2;
  uint uVar3;
  char *pcVar4;
  int test_count;
  int test_suite_count;
  string local_78;
  string f;
  string local_38;
  
  if (FLAGS_gtest_repeat != 1) {
    printf("\nRepeating all tests (iteration %d) . . .\n\n",(ulong)(iteration + 1));
  }
  std::__cxx11::string::string((string *)&f,(string *)FLAGS_gtest_filter_abi_cxx11_);
  bVar1 = String::CStringEquals(f._M_dataplus._M_p,"*");
  if (!bVar1) {
    ColoredPrintf(kYellow,"Note: %s filter = %s\n","Google Test",f._M_dataplus._M_p);
  }
  bVar1 = ShouldShard("GTEST_TOTAL_SHARDS","GTEST_SHARD_INDEX",false);
  if (bVar1) {
    iVar2 = Int32FromEnvOrDie("GTEST_SHARD_INDEX",-1);
    pcVar4 = getenv("GTEST_TOTAL_SHARDS");
    ColoredPrintf(kYellow,"Note: This is test shard %d of %s.\n",(ulong)(iVar2 + 1),pcVar4);
  }
  if (FLAGS_gtest_shuffle == '\x01') {
    ColoredPrintf(kYellow,"Note: Randomizing tests\' orders with a seed of %d .\n",
                  (ulong)(uint)unit_test->impl_->random_seed_);
  }
  ColoredPrintf(kGreen,"[==========] ");
  uVar3 = UnitTest::test_to_run_count(unit_test);
  FormatTestCount_abi_cxx11_(&local_78,(testing *)(ulong)uVar3,test_count);
  uVar3 = UnitTest::test_suite_to_run_count(unit_test);
  FormatTestSuiteCount_abi_cxx11_(&local_38,(testing *)(ulong)uVar3,test_suite_count);
  printf("Running %s from %s.\n",local_78._M_dataplus._M_p,local_38._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  fflush(_stdout);
  std::__cxx11::string::~string((string *)&f);
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestIterationStart(
    const UnitTest& unit_test, int iteration) {
  if (GTEST_FLAG_GET(repeat) != 1)
    printf("\nRepeating all tests (iteration %d) . . .\n\n", iteration + 1);

  std::string f = GTEST_FLAG_GET(filter);
  const char* const filter = f.c_str();

  // Prints the filter if it's not *.  This reminds the user that some
  // tests may be skipped.
  if (!String::CStringEquals(filter, kUniversalFilter)) {
    ColoredPrintf(GTestColor::kYellow, "Note: %s filter = %s\n", GTEST_NAME_,
                  filter);
  }

  if (internal::ShouldShard(kTestTotalShards, kTestShardIndex, false)) {
    const int32_t shard_index = Int32FromEnvOrDie(kTestShardIndex, -1);
    ColoredPrintf(GTestColor::kYellow, "Note: This is test shard %d of %s.\n",
                  static_cast<int>(shard_index) + 1,
                  internal::posix::GetEnv(kTestTotalShards));
  }

  if (GTEST_FLAG_GET(shuffle)) {
    ColoredPrintf(GTestColor::kYellow,
                  "Note: Randomizing tests' orders with a seed of %d .\n",
                  unit_test.random_seed());
  }

  ColoredPrintf(GTestColor::kGreen, "[==========] ");
  printf("Running %s from %s.\n",
         FormatTestCount(unit_test.test_to_run_count()).c_str(),
         FormatTestSuiteCount(unit_test.test_suite_to_run_count()).c_str());
  fflush(stdout);
}